

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::VertexEmitterShader::genGeometrySource_abi_cxx11_
          (string *__return_storage_ptr__,VertexEmitterShader *this,ContextType *contextType,
          int emitCountA,int endCountA,int emitCountB,int endCountB,
          GeometryShaderOutputType outputType)

{
  ostream *poVar1;
  GeometryShaderOutputType outputType_00;
  string local_208;
  int local_1e8;
  int local_1e4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  undefined1 local_1a8 [8];
  ostringstream str;
  int emitCountB_local;
  int endCountA_local;
  int emitCountA_local;
  ContextType *contextType_local;
  VertexEmitterShader *this_local;
  
  str._372_4_ = emitCountB;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::operator<<((ostream *)local_1a8,"${GLSL_VERSION_DECL}\n");
  std::operator<<((ostream *)local_1a8,"${GLSL_EXT_GEOMETRY_SHADER}");
  std::operator<<((ostream *)local_1a8,"layout(points) in;\n");
  poVar1 = std::operator<<((ostream *)local_1a8,"layout(");
  outputTypeToGLString_abi_cxx11_
            ((string *)&i_1,(_anonymous_namespace_ *)(ulong)outputType,outputType_00);
  poVar1 = std::operator<<(poVar1,(string *)&i_1);
  poVar1 = std::operator<<(poVar1,", max_vertices = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,emitCountA + str._372_4_);
  std::operator<<(poVar1,") out;");
  std::__cxx11::string::~string((string *)&i_1);
  std::operator<<((ostream *)local_1a8,"\n");
  std::operator<<((ostream *)local_1a8,
                  "in highp vec4 v_geom_FragColor[];\nout highp vec4 v_frag_FragColor;\n\nvoid main (void)\n{\n\tconst highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n\tconst highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n\tconst highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n\tconst highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n\tconst highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n\tconst highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n\n"
                 );
  for (i_2 = 0; i_2 < emitCountA; i_2 = i_2 + 1) {
    poVar1 = std::operator<<((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + position")
    ;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_2);
    std::operator<<(poVar1,
                    ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                   );
  }
  for (i_3 = 0; i_3 < endCountA; i_3 = i_3 + 1) {
    std::operator<<((ostream *)local_1a8,"\tEndPrimitive();\n");
  }
  for (local_1e4 = 0; local_1e4 < (int)str._372_4_; local_1e4 = local_1e4 + 1) {
    poVar1 = std::operator<<((ostream *)local_1a8,"\tgl_Position = gl_in[0].gl_Position + position")
    ;
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,emitCountA + local_1e4);
    std::operator<<(poVar1,
                    ";\n\tgl_PrimitiveID = gl_PrimitiveIDIn;\n\tv_frag_FragColor = v_geom_FragColor[0];\n\tEmitVertex();\n\n"
                   );
  }
  for (local_1e8 = 0; local_1e8 < endCountB; local_1e8 = local_1e8 + 1) {
    std::operator<<((ostream *)local_1a8,"\tEndPrimitive();\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::ostringstream::str();
  anon_unknown_1::specializeShader(__return_storage_ptr__,&local_208,contextType);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string	VertexEmitterShader::genGeometrySource (const glu::ContextType& contextType, int emitCountA, int endCountA, int emitCountB, int endCountB, rr::GeometryShaderOutputType outputType) const
{
	std::ostringstream str;

	str << "${GLSL_VERSION_DECL}\n";
	str << "${GLSL_EXT_GEOMETRY_SHADER}";
	str << "layout(points) in;\n";
	str << "layout(" << outputTypeToGLString(outputType) << ", max_vertices = " << (emitCountA+emitCountB) << ") out;";
	str << "\n";

	str <<	"in highp vec4 v_geom_FragColor[];\n"
			"out highp vec4 v_frag_FragColor;\n"
			"\n"
			"void main (void)\n"
			"{\n"
			"	const highp vec4 position0 = vec4(-0.5,  0.5, 0.0, 0.0);\n"
			"	const highp vec4 position1 = vec4( 0.0,  0.1, 0.0, 0.0);\n"
			"	const highp vec4 position2 = vec4( 0.5,  0.5, 0.0, 0.0);\n"
			"	const highp vec4 position3 = vec4( 0.7, -0.2, 0.0, 0.0);\n"
			"	const highp vec4 position4 = vec4( 0.2,  0.2, 0.0, 0.0);\n"
			"	const highp vec4 position5 = vec4( 0.4, -0.3, 0.0, 0.0);\n"
			"\n";

	for (int i = 0; i < emitCountA; ++i)
		str <<	"	gl_Position = gl_in[0].gl_Position + position" << i << ";\n"
				"	gl_PrimitiveID = gl_PrimitiveIDIn;\n"
				"	v_frag_FragColor = v_geom_FragColor[0];\n"
				"	EmitVertex();\n"
				"\n";

	for (int i = 0; i < endCountA; ++i)
		str << "	EndPrimitive();\n";

	for (int i = 0; i < emitCountB; ++i)
		str <<	"	gl_Position = gl_in[0].gl_Position + position" << (emitCountA + i) << ";\n"
				"	gl_PrimitiveID = gl_PrimitiveIDIn;\n"
				"	v_frag_FragColor = v_geom_FragColor[0];\n"
				"	EmitVertex();\n"
				"\n";

	for (int i = 0; i < endCountB; ++i)
		str << "	EndPrimitive();\n";

	str << "}\n";

	return specializeShader(str.str(), contextType);
}